

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O3

void __thiscall PointPseudoLog::test_method(PointPseudoLog *this)

{
  double dVar1;
  double dVar2;
  RealSpace R3;
  Point y;
  Point x;
  undefined **local_3a8;
  ulong uStack_3a0;
  undefined8 *local_398;
  char **local_390;
  undefined8 uStack_388;
  double local_378;
  double dStack_370;
  double local_368;
  undefined8 uStack_360;
  double local_358;
  double dStack_350;
  double local_348;
  undefined1 local_340;
  undefined8 local_338;
  shared_count sStack_330;
  double *local_328;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  code *local_2d8 [11];
  void *local_280;
  void *local_270;
  double *local_260;
  void *local_258;
  void *local_248;
  undefined8 uStack_240;
  Ref local_138 [8];
  void *local_130;
  ConstSubPoint local_120 [272];
  
  mnf::RealSpace::RealSpace((RealSpace *)local_2d8,3);
  local_358 = 1.0;
  dStack_350 = 2.0;
  local_348 = 3.0;
  local_248 = (void *)0x0;
  uStack_240 = 0;
  local_258 = (void *)0x3;
  local_260 = &local_358;
  mnf::Manifold::createPoint(local_138);
  free(local_248);
  sStack_330.pi_ = (sp_counted_base *)&DAT_4000000000000000;
  local_3a8 = (undefined **)0x0;
  uStack_3a0 = 0;
  local_390 = (char **)0x0;
  uStack_388 = 0;
  local_328 = &local_358;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  construct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ();
  mnf::Manifold::createPoint((Ref *)&local_260);
  free(local_390);
  mnf::Point::pseudoLog((Point *)&local_3a8);
  if (uStack_3a0 == 3) {
    local_378 = (double)*local_3a8;
    dStack_370 = (double)local_3a8[1];
    local_368 = (double)local_3a8[2];
    uStack_360 = 0;
    free(local_3a8);
    local_2e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,0x70);
    dVar1 = local_348 * local_348 + dStack_350 * dStack_350 + local_358 * local_358;
    dVar2 = local_368 * local_368 + dStack_370 * dStack_370 + local_378 * local_378;
    if (dVar2 <= dVar1) {
      dVar1 = dVar2;
    }
    local_340 = (local_368 + local_348) * (local_368 + local_348) +
                (dStack_370 + dStack_350) * (dStack_370 + dStack_350) +
                (local_378 + local_358) * (local_378 + local_358) <= dVar1 * 1e-24;
    local_338 = 0;
    sStack_330.pi_ = (sp_counted_base *)0x0;
    local_390 = &local_308;
    local_308 = "res.isApprox(-v)";
    local_300 = "";
    uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
    local_3a8 = &PTR__lazy_ostream_00128c30;
    local_398 = &boost::unit_test::lazy_ostream::inst;
    local_318 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
    ;
    local_310 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_330);
    mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_248);
    free(local_258);
    mnf::ConstSubPoint::~ConstSubPoint(local_120);
    free(local_130);
    local_2d8[0] = mnf::operator+;
    free(local_270);
    free(local_280);
    mnf::Manifold::~Manifold((Manifold *)local_2d8);
    return;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(PointPseudoLog)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);
  Point x = R3.createPoint(v);
  Point y = R3.createPoint(2 * v);
  Eigen::Vector3d res;
  res.setZero();
  res = y.pseudoLog(x);
  BOOST_CHECK(res.isApprox(-v));
}